

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O0

void double_conversion::InitialScaledStartValuesPositiveExponent
               (uint64_t significand,int exponent,int estimated_power,bool need_boundary_deltas,
               Bignum *numerator,Bignum *denominator,Bignum *delta_minus,Bignum *delta_plus)

{
  byte bVar1;
  byte in_CL;
  undefined4 in_EDX;
  undefined4 in_ESI;
  Bignum *in_R8;
  undefined8 in_R9;
  int in_stack_00000028;
  uint16_t in_stack_0000002e;
  int shift_amount;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  
  shift_amount = (int)((ulong)in_R9 >> 0x20);
  bVar1 = in_CL & 1;
  Bignum::AssignUInt64
            ((Bignum *)CONCAT44(in_ESI,in_EDX),
             CONCAT17(in_CL,CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)) &
             0x1ffffffffffffff);
  Bignum::ShiftLeft(in_R8,shift_amount);
  Bignum::AssignPowerUInt16(delta_minus,in_stack_0000002e,in_stack_00000028);
  if ((bVar1 & 1) != 0) {
    Bignum::ShiftLeft(in_R8,shift_amount);
    Bignum::ShiftLeft(in_R8,shift_amount);
    Bignum::AssignUInt16
              ((Bignum *)CONCAT44(in_ESI,in_EDX),CONCAT11(bVar1,in_stack_ffffffffffffffee));
    Bignum::ShiftLeft(in_R8,shift_amount);
    Bignum::AssignUInt16
              ((Bignum *)CONCAT44(in_ESI,in_EDX),CONCAT11(bVar1,in_stack_ffffffffffffffee));
    Bignum::ShiftLeft(in_R8,shift_amount);
  }
  return;
}

Assistant:

static void InitialScaledStartValuesPositiveExponent(
    uint64_t significand, int exponent,
    int estimated_power, bool need_boundary_deltas,
    Bignum* numerator, Bignum* denominator,
    Bignum* delta_minus, Bignum* delta_plus) {
  // A positive exponent implies a positive power.
  DOUBLE_CONVERSION_ASSERT(estimated_power >= 0);
  // Since the estimated_power is positive we simply multiply the denominator
  // by 10^estimated_power.

  // numerator = v.
  numerator->AssignUInt64(significand);
  numerator->ShiftLeft(exponent);
  // denominator = 10^estimated_power.
  denominator->AssignPowerUInt16(10, estimated_power);

  if (need_boundary_deltas) {
    // Introduce a common denominator so that the deltas to the boundaries are
    // integers.
    denominator->ShiftLeft(1);
    numerator->ShiftLeft(1);
    // Let v = f * 2^e, then m+ - v = 1/2 * 2^e; With the common
    // denominator (of 2) delta_plus equals 2^e.
    delta_plus->AssignUInt16(1);
    delta_plus->ShiftLeft(exponent);
    // Same for delta_minus. The adjustments if f == 2^p-1 are done later.
    delta_minus->AssignUInt16(1);
    delta_minus->ShiftLeft(exponent);
  }
}